

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O1

void __thiscall Func::ThrowIfScriptClosed(Func *this)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  undefined8 uVar5;
  
  iVar3 = (*this->m_scriptContextInfo->_vptr_ScriptContextInfo[0x24])();
  if ((char)iVar3 == '\0') {
    return;
  }
  if ((this->m_isBackgroundJIT == false) &&
     (*(char *)((long)&this->m_scriptContextInfo[0x266]._vptr_ScriptContextInfo + 1) == '\x01')) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                       ,0x79c,"(IsBackgroundJIT() || !GetScriptContext()->IsActuallyClosed())",
                       "IsBackgroundJIT() || !GetScriptContext()->IsActuallyClosed()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  uVar5 = __cxa_allocate_exception(1);
  __cxa_throw(uVar5,&Js::OperationAbortedException::typeinfo,0);
}

Assistant:

void Func::ThrowIfScriptClosed()
{
    if (GetScriptContextInfo()->IsClosed())
    {
        // Should not be jitting something in the foreground when the script context is actually closed
        Assert(IsBackgroundJIT() || !GetScriptContext()->IsActuallyClosed());

        throw Js::OperationAbortedException();
    }
}